

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O1

bool __thiscall CheckBox::update(CheckBox *this,int mouseX,int mouseY,bool clicked)

{
  Transformable *this_00;
  bool bVar1;
  Vector2f *pVVar2;
  undefined3 in_register_00000009;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  FloatRect FVar18;
  float fStack_34;
  undefined1 auVar16 [16];
  
  uVar3 = CONCAT31(in_register_00000009,clicked);
  if ((this->super_UIComponent).super_Transformable.field_0xa9 == '\x01') {
    this_00 = &(this->super_UIComponent).super_Transformable;
    pVVar2 = sf::Transformable::getPosition(this_00);
    fVar9 = pVVar2->x;
    pVVar2 = sf::Transformable::getPosition(this_00);
    fVar13 = pVVar2->y;
    fStack_34 = 0.0;
    fVar10 = 0.0;
    FVar18 = sf::Shape::getGlobalBounds(&(this->button).super_Shape);
    fVar6 = FVar18.left;
    fVar7 = FVar18.top;
    fVar11 = (float)(mouseX - (int)fVar9);
    fVar12 = (float)(mouseY - (int)fVar13);
    fVar8 = FVar18.width + fVar6;
    fVar9 = FVar18.height + fVar7;
    fVar13 = fVar8;
    if (fVar8 <= fVar6) {
      fVar13 = fVar6;
    }
    auVar14._4_4_ = fVar9;
    auVar14._0_4_ = fVar8;
    auVar14._8_4_ = fStack_34 + extraout_XMM0_Dc;
    auVar14._12_4_ = fVar10 + extraout_XMM0_Dd;
    auVar15._8_4_ = extraout_XMM0_Dc;
    auVar15._0_8_ = FVar18._0_8_;
    auVar15._12_4_ = extraout_XMM0_Dd;
    auVar15 = minps(auVar14,auVar15);
    iVar4 = -(uint)(fVar11 < auVar15._0_4_);
    iVar5 = -(uint)(fVar12 < auVar15._4_4_);
    auVar17._4_4_ = iVar5;
    auVar17._0_4_ = iVar4;
    auVar17._8_4_ = iVar5;
    auVar17._12_4_ = iVar5;
    auVar16._8_8_ = auVar17._8_8_;
    auVar16._4_4_ = iVar4;
    auVar16._0_4_ = iVar4;
    uVar3 = movmskpd(uVar3,auVar16);
    if (((fVar13 <= fVar11 | (byte)uVar3 | (byte)uVar3 >> 1) & 1) == 0) {
      if (fVar9 <= fVar7) {
        fVar9 = fVar7;
      }
      bVar1 = fVar12 < fVar9;
    }
    else {
      bVar1 = false;
    }
    if ((bVar1 & clicked) == 1) {
      setChecked(this,(bool)(this->_checked ^ 1));
    }
  }
  return false;
}

Assistant:

bool CheckBox::update(int mouseX, int mouseY, bool clicked) {
    if (visible) {
        mouseX -= static_cast<int>(getPosition().x);
        mouseY -= static_cast<int>(getPosition().y);
        if (button.getGlobalBounds().contains(static_cast<float>(mouseX), static_cast<float>(mouseY)) && clicked) {
            setChecked(!_checked);
        }
    }
    return false;
}